

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas_io.c
# Opt level: O2

int IDAGetRootInfo(void *ida_mem,int *rootsfound)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  if (ida_mem == (void *)0x0) {
    iVar3 = -0x14;
    IDAProcessError((IDAMem)0x0,-0x14,0x625,"IDAGetRootInfo",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas_io.c"
                    ,"ida_mem = NULL illegal.");
  }
  else {
    iVar3 = 0;
    uVar1 = (ulong)*(uint *)((long)ida_mem + 0x780);
    if ((int)*(uint *)((long)ida_mem + 0x780) < 1) {
      uVar1 = 0;
    }
    for (uVar2 = 0; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      rootsfound[uVar2] = *(int *)(*(long *)((long)ida_mem + 0x788) + uVar2 * 4);
    }
  }
  return iVar3;
}

Assistant:

int IDAGetRootInfo(void* ida_mem, int* rootsfound)
{
  IDAMem IDA_mem;
  int i, nrt;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }

  IDA_mem = (IDAMem)ida_mem;

  nrt = IDA_mem->ida_nrtfn;

  for (i = 0; i < nrt; i++) { rootsfound[i] = IDA_mem->ida_iroots[i]; }

  return (IDA_SUCCESS);
}